

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O1

void __thiscall
agge::tests::RendererTests::RenditionAdapterBlendsAllowedPixelRegionsWithNoLimitations
          (RendererTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer puVar3;
  int *piVar4;
  ulong uVar5;
  uint8_t covers2 [3];
  short covers1 [4];
  bitmap<int,_0UL,_0UL> bitmap1;
  bitmap<unsigned_char,_0UL,_0UL> bitmap2;
  blender<unsigned_char,_unsigned_char> blender2;
  blender<int,_short> blender1;
  uint8_t reference2 [20];
  int reference1 [35];
  cover_type local_194 [4];
  cover_type_conflict local_190 [4];
  vector<int,_std::allocator<int>_> local_188;
  ulong local_170;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  ulong local_150;
  blender<unsigned_char,_unsigned_char> local_148;
  blender<int,_short> local_128;
  string local_110;
  LocationInfo local_f0;
  uchar local_c8 [32];
  int local_a8 [36];
  
  local_190[0] = 0x1001;
  local_190[1] = 2;
  local_190[2] = 0x4003;
  local_190[3] = 0xe2;
  local_128.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_short>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_short>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_short>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_short>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_short>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_short>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(0x8c);
  piVar4 = local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start + 0x23;
  local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = piVar4;
  memset(local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start,0,0x8c);
  local_170 = 0x500000007;
  local_194[2] = 0x91;
  local_194[0] = 0xed;
  local_194[1] = '\b';
  local_148.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = piVar4;
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x14);
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 0x14;
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\0';
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = '\0';
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[8] = '\0';
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[9] = '\0';
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[10] = '\0';
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = '\0';
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = '\0';
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = '\0';
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = '\0';
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = '\0';
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = '\0';
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = '\0';
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = '\0';
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = '\0';
  local_150 = 0x400000005;
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  mocks::blender<int,_short>::operator()
            (&local_128,
             local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,0,0,3,local_190);
  mocks::blender<int,_short>::operator()
            (&local_128,
             local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start + (local_170 & 0xffffffff),0,1,2,local_190);
  mocks::blender<int,_short>::operator()
            (&local_128,
             local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start + (local_170 & 0xffffffff) * 4 + 3,3,4,4,local_190);
  puVar3 = local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = local_150 & 0xffffffff;
  mocks::blender<unsigned_char,_unsigned_char>::operator()
            (&local_148,
             local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + uVar5 * 2 + 4,4,2,1,local_194);
  mocks::blender<unsigned_char,_unsigned_char>::operator()
            (&local_148,puVar3 + uVar5 * 2 + 1,1,2,3,local_194);
  mocks::blender<unsigned_char,_unsigned_char>::operator()
            (&local_148,
             local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + (local_150 & 0xffffffff) * 3 + 2,2,3,3,local_194);
  memcpy(local_a8,&DAT_001a1740,0x8c);
  local_c8[0] = '\0';
  local_c8[1] = '\0';
  local_c8[2] = '\0';
  local_c8[3] = '\0';
  local_c8[4] = '\0';
  local_c8[5] = '\0';
  local_c8[6] = '\0';
  local_c8[7] = '\0';
  local_c8[8] = '\0';
  local_c8[9] = '\0';
  local_c8[10] = '\0';
  local_c8[0xb] = 0xed;
  local_c8[0xc] = '\b';
  local_c8[0xd] = 0x91;
  local_c8[0xe] = 0xed;
  local_c8[0xf] = '\0';
  local_c8[0x10] = '\0';
  local_c8[0x11] = 0xed;
  local_c8[0x12] = '\b';
  local_c8[0x13] = 0x91;
  paVar1 = &local_110.field_2;
  local_110._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_f0,&local_110,0x290);
  ut::are_equal<int,35ul,std::vector<int,std::allocator<int>>>
            ((int (*) [35])local_a8,&local_188,&local_f0);
  paVar2 = &local_f0.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_f0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  local_110._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_f0,&local_110,0x291);
  ut::are_equal<unsigned_char,20ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((uchar (*) [20])local_c8,&local_168,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_f0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_148.filling_log.
      super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.filling_log.
                    super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_128.filling_log.
      super__Vector_base<agge::tests::mocks::blender<int,_short>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_short>::fill_log_entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.filling_log.
                    super__Vector_base<agge::tests::mocks::blender<int,_short>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_short>::fill_log_entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

test( RenditionAdapterBlendsAllowedPixelRegionsWithNoLimitations )
			{
				// INIT
				short covers1[] = { 0x1001, 0x0002, 0x4003, 0x00E2, };
				mocks::blender<int, short> blender1;
				mocks::bitmap<int> bitmap1(7, 5);
				renderer::adapter< mocks::bitmap<int>, mocks::blender<int, short> > r1(bitmap1, zero(), 0, blender1);

				uint8_t covers2[] = { 0xED, 0x08, 0x91, };
				mocks::blender<uint8_t, uint8_t> blender2;
				mocks::bitmap<uint8_t> bitmap2(5, 4);
				renderer::adapter< mocks::bitmap<uint8_t>, mocks::blender<uint8_t, uint8_t> > r2(bitmap2, zero(), 0, blender2);

				// ACT
				r1.set_y(0);
				r1(0, 3, covers1);
				
				r1.set_y(1);
				r1(0, 2, covers1);
				
				r1.set_y(4);
				r1(3, 4, covers1);

				r2.set_y(2);
				r2(4, 1, covers2);
				r2(1, 3, covers2);
				
				r2.set_y(3);
				r2(2, 3, covers2);

				// ASSERT
				int reference1[] = {
					0x00001001, 0x00000002, 0x00004003, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x01001001, 0x01000002, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x04031001, 0x04030002, 0x04034003, 0x040300E2,
				};
				uint8_t reference2[] = {
					0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0xED, 0x08, 0x91, 0xED,
					0x00, 0x00, 0xED, 0x08, 0x91,
				};

				assert_equal(reference1, bitmap1.data);
				assert_equal(reference2, bitmap2.data);
			}